

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O0

uint16 Js::PolymorphicInlineCache::GetNextSize(uint16 currentSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint16 local_a;
  uint16 currentSize_local;
  
  if (currentSize == 0x20) {
    local_a = 0;
  }
  else if (currentSize == 1) {
    local_a = 4;
  }
  else {
    if ((currentSize < 4) || (0x10 < currentSize)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                  ,0x20d,"(currentSize >= 4 && currentSize <= (32 / 2))",
                                  "currentSize >= MinPolymorphicInlineCacheSize && currentSize <= (MaxPolymorphicInlineCacheSize / 2)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_a = currentSize << 1;
  }
  return local_a;
}

Assistant:

static uint16 GetNextSize(uint16 currentSize)
        {
            if (currentSize == MaxPolymorphicInlineCacheSize)
            {
                return 0;
            }
            else if (currentSize == MinPropertyStringInlineCacheSize)
            {
                CompileAssert(MinPropertyStringInlineCacheSize < MinPolymorphicInlineCacheSize);
                return MinPolymorphicInlineCacheSize;
            }
            else
            {
                Assert(currentSize >= MinPolymorphicInlineCacheSize && currentSize <= (MaxPolymorphicInlineCacheSize / 2));
                return currentSize * 2;
            }
        }